

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O0

LispPTR * N_OP_unbind(LispPTR *stack_pointer)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  ushort local_22;
  LispPTR value;
  DLword i;
  LispPTR *ppvar;
  LispPTR *pLStack_10;
  DLword num;
  LispPTR *stack_pointer_local;
  
  pLStack_10 = stack_pointer;
  do {
    puVar3 = pLStack_10 + -1;
    puVar1 = pLStack_10 + -1;
    pLStack_10 = puVar3;
  } while ((*puVar1 & 0x80000000) == 0);
  uVar2 = *puVar3;
  _value = MachineState.pvar + (long)(int)(uVar2 & 0xffff) + 2;
  for (local_22 = 0; local_22 < (ushort)((ushort)(uVar2 >> 0x10) ^ 0xffff); local_22 = local_22 + 1)
  {
    _value[-2] = 0xffff;
    _value[-1] = 0xffff;
    _value = _value + -2;
  }
  return puVar3;
}

Assistant:

LispPTR *N_OP_unbind(LispPTR *stack_pointer) {
  DLword num;     /* number of unbind sot */
  LispPTR *ppvar; /* pointer to last PVAR slot. */
  DLword i;       /* temporary for control */
  LispPTR value;

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_unbind()\n");
#endif

  /* now, stack_pointer points the latter part in slot */
  for (; !(*--stack_pointer & 0x80000000);)
    ; /* scan (until MSB == 1) */

  value = *stack_pointer;
  num = (DLword) ~(value >> 16);
  ppvar = (LispPTR *)(PVar + 2 + GetLoWord(value));
  value = 0xffffffff;
  for (i = 0; i < num; i++) { *--ppvar = value; }
  return (stack_pointer);
}